

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

QStringList * __thiscall
QTextEditMimeData::formats(QStringList *__return_storage_ptr__,QTextEditMimeData *this)

{
  char cVar1;
  Char *s;
  QStringList *ret;
  int i;
  int index;
  long in_FS_OFFSET;
  QLatin1String QStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QTextDocumentFragment::isEmpty();
  if (cVar1 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<QString>::reserve(__return_storage_ptr__,4);
    for (index = 0; index != 4; index = index + 1) {
      s = QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_>::at
                    (&supportedMimeTypes,index);
      QLatin1String::QLatin1String(&QStack_38,s);
      QList<QString>::emplaceBack<QLatin1String>(__return_storage_ptr__,&QStack_38);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00484b09;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00484b09:
      __stack_chk_fail();
    }
    QMimeData::formats();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QTextEditMimeData::formats() const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        QStringList ret;
        ret.reserve(size);
        for (int i = 0; i < size; ++i)
            ret.emplace_back(QLatin1StringView(supportedMimeTypes.at(i)));

        return ret;
    }

    return QMimeData::formats();
}